

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDGrammar.hpp
# Opt level: O3

XMLSize_t __thiscall
xercesc_4_0::DTDGrammar::getElemId
          (DTDGrammar *this,uint param_1,XMLCh *param_2,XMLCh *qName,uint param_4)

{
  NameIdPool<xercesc_4_0::DTDElementDecl> *pNVar1;
  bool bVar2;
  ulong uVar3;
  XMLCh *pXVar4;
  XMLCh XVar5;
  RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *pRVar6;
  
  pNVar1 = this->fElemDeclPool;
  if (pNVar1->fIdCounter != 0) {
    if ((qName == (XMLCh *)0x0) || (uVar3 = (ulong)(ushort)*qName, uVar3 == 0)) {
      uVar3 = 0;
    }
    else {
      XVar5 = qName[1];
      if (XVar5 != L'\0') {
        pXVar4 = qName + 2;
        do {
          uVar3 = (ulong)(ushort)XVar5 + (uVar3 >> 0x18) + uVar3 * 0x26;
          XVar5 = *pXVar4;
          pXVar4 = pXVar4 + 1;
        } while (XVar5 != L'\0');
      }
      uVar3 = uVar3 % (pNVar1->fBucketList).fHashModulus;
    }
    pRVar6 = (pNVar1->fBucketList).fBucketList[uVar3];
    if (pRVar6 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0) {
      do {
        bVar2 = StringHasher::equals
                          ((StringHasher *)&(pNVar1->fBucketList).field_0x30,qName,pRVar6->fKey);
        if (bVar2) {
          if (pRVar6->fData == (DTDElementDecl *)0x0) {
            return 0xfffffffe;
          }
          return (pRVar6->fData->super_XMLElementDecl).fId;
        }
        pRVar6 = pRVar6->fNext;
      } while (pRVar6 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0);
    }
  }
  return 0xfffffffe;
}

Assistant:

inline XMLSize_t DTDGrammar::getElemId (const   unsigned int
                                              , const XMLCh* const
                                              , const XMLCh* const    qName
                                              , unsigned int) const
{
    //
    //  In this case, we don't return zero to mean 'not found', so we have to
    //  map it to the official not found value if we don't find it.
    //
    const DTDElementDecl* decl = fElemDeclPool->getByKey(qName);
    if (!decl)
        return XMLElementDecl::fgInvalidElemId;
    return decl->getId();
}